

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O1

void __thiscall C3DFile::readPointSection(C3DFile *this,ifstream *datastream)

{
  vector<float,std::allocator<float>> *pvVar1;
  long *plVar2;
  pointer pFVar3;
  iterator iVar4;
  iterator iVar5;
  pointer pvVar6;
  ushort uVar7;
  short sVar8;
  ulong uVar9;
  int iVar10;
  iterator __position;
  vector<FramePointInfo,std::allocator<FramePointInfo>> *this_00;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  vector<FramePointInfo,_std::allocator<FramePointInfo>_> frame_data;
  FloatMarkerData marker_data;
  value_type local_f8;
  ulong local_d8;
  uint local_cc;
  undefined1 local_c8 [4];
  float fStack_c4;
  undefined8 uStack_c0;
  pointer local_b8;
  pointer pfStack_b0;
  pointer local_a8;
  pointer pfStack_a0;
  pointer local_98;
  pointer pfStack_90;
  pointer local_88;
  pointer puStack_80;
  pointer local_78;
  pointer puStack_70;
  pointer local_68;
  pointer puStack_60;
  pointer local_58;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_48 = getParamGeneric<float>(this,"POINT:SCALE",-1.0);
  if (0.0 <= local_48) {
    this->uses_integer_data = true;
    uStack_44 = extraout_XMM0_Db;
    uStack_40 = extraout_XMM0_Dc;
    uStack_3c = extraout_XMM0_Dd;
  }
  else {
    this->uses_integer_data = false;
    local_48 = -local_48;
    uStack_44 = extraout_XMM0_Db ^ 0x80000000;
    uStack_40 = extraout_XMM0_Dc ^ 0x80000000;
    uStack_3c = extraout_XMM0_Dd ^ 0x80000000;
  }
  uVar7 = getParamGeneric<short>(this,"POINT:DATA_START",-1);
  if ((short)uVar7 < 3) {
LAB_001074b9:
    __assert_fail("data_start > 512",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x12f,"void C3DFile::readPointSection(ifstream &)");
  }
  std::istream::seekg((long)datastream,(uint)uVar7 * 0x200 - 0x200);
  sVar8 = getParamGeneric<short>(this,"POINT:USED",-1);
  iVar10 = *(int *)&(this->header).last_frame;
  local_d8 = CONCAT44(local_d8._4_4_,(uint)(this->header).first_frame);
  if (0 < sVar8) {
    uVar12 = (int)sVar8;
    do {
      local_68 = (pointer)0x0;
      puStack_60 = (pointer)0x0;
      local_78 = (pointer)0x0;
      puStack_70 = (pointer)0x0;
      local_88 = (pointer)0x0;
      puStack_80 = (pointer)0x0;
      local_98 = (pointer)0x0;
      pfStack_90 = (pointer)0x0;
      local_a8 = (pointer)0x0;
      pfStack_a0 = (pointer)0x0;
      local_b8 = (pointer)0x0;
      pfStack_b0 = (pointer)0x0;
      _local_c8 = (pointer)0x0;
      uStack_c0 = (pointer)0x0;
      local_58 = (pointer)0x0;
      std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::push_back
                (&this->float_point_data,(value_type *)local_c8);
      local_f8.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
      ::push_back(&this->point_data,&local_f8);
      if (local_f8.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_f8.
                              super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.
                              super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68 != (pointer)0x0) {
        operator_delete(local_68,(long)local_58 - (long)local_68);
      }
      if (puStack_80 != (pointer)0x0) {
        operator_delete(puStack_80,(long)puStack_70 - (long)puStack_80);
      }
      if (local_98 != (pointer)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
      if (pfStack_b0 != (pointer)0x0) {
        operator_delete(pfStack_b0,(long)pfStack_a0 - (long)pfStack_b0);
      }
      if (_local_c8 != (pointer)0x0) {
        operator_delete(_local_c8,(long)local_b8 - (long)_local_c8);
      }
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  iVar10 = iVar10 + 1;
  if ((short)iVar10 != (short)local_d8) {
    uVar12 = iVar10 - (int)local_d8;
    local_cc = 1;
    if (1 < (ushort)uVar12) {
      local_cc = uVar12;
    }
    local_cc = local_cc & 0xffff;
    local_d8 = 0;
    do {
      if (0 < sVar8) {
        lVar14 = 0;
        lVar11 = 0;
        uVar13 = 0;
        do {
          if (this->uses_integer_data == false) {
            std::istream::read((char *)datastream,(long)local_c8);
            pFVar3 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pvVar1 = (vector<float,std::allocator<float>> *)
                     ((long)&(pFVar3->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                     lVar11);
            iVar4._M_current =
                 *(float **)
                  ((long)&(pFVar3->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar11 + 8);
            if (iVar4._M_current ==
                *(float **)
                 ((long)&(pFVar3->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar11 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (pvVar1,iVar4,(float *)local_c8);
            }
            else {
              *iVar4._M_current = (float)local_c8;
              *(float **)(pvVar1 + 8) = iVar4._M_current + 1;
            }
            pFVar3 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar4._M_current =
                 *(float **)
                  ((long)&(pFVar3->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar11 + 8);
            if (iVar4._M_current ==
                *(float **)
                 ((long)&(pFVar3->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar11 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)
                         ((long)&(pFVar3->y).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl + lVar11),iVar4,(float *)(local_c8 + 4));
            }
            else {
              *iVar4._M_current = fStack_c4;
              *(float **)
               ((long)&(pFVar3->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
               lVar11 + 8) = iVar4._M_current + 1;
            }
            pFVar3 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar4._M_current =
                 *(float **)
                  ((long)&(pFVar3->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar11 + 8);
            if (iVar4._M_current ==
                *(float **)
                 ((long)&(pFVar3->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar11 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)
                         ((long)&(pFVar3->z).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl + lVar11),iVar4,(float *)&uStack_c0);
            }
            else {
              *iVar4._M_current = (float)uStack_c0;
              *(float **)
               ((long)&(pFVar3->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
               lVar11 + 8) = iVar4._M_current + 1;
            }
            pFVar3 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar5._M_current =
                 *(uchar **)
                  ((long)&(pFVar3->cameras).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar11 + 8);
            if (iVar5._M_current ==
                *(uchar **)
                 ((long)&(pFVar3->cameras).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 lVar11 + 0x10)) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         ((long)&(pFVar3->cameras).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar11),iVar5,(uchar *)((long)&uStack_c0 + 4));
            }
            else {
              *iVar5._M_current = uStack_c0._4_1_;
              plVar2 = (long *)((long)&(pFVar3->cameras).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl + lVar11 + 8);
              *plVar2 = *plVar2 + 1;
            }
            pFVar3 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar5._M_current =
                 *(uchar **)
                  ((long)&(pFVar3->residual).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar11 + 8);
            if (iVar5._M_current ==
                *(uchar **)
                 ((long)&(pFVar3->residual).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 lVar11 + 0x10)) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         ((long)&(pFVar3->residual).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar11),iVar5,(uchar *)((long)&uStack_c0 + 5));
            }
            else {
              *iVar5._M_current = uStack_c0._5_1_;
              plVar2 = (long *)((long)&(pFVar3->residual).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl + lVar11 + 8);
              *plVar2 = *plVar2 + 1;
            }
            pvVar6 = (this->point_data).
                     super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar9 = ((long)(this->point_data).
                           super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
                    -0x5555555555555555;
            if (uVar9 < uVar13 || uVar9 - uVar13 == 0) goto LAB_001074a8;
            this_00 = (vector<FramePointInfo,std::allocator<FramePointInfo>> *)
                      ((long)&(pvVar6->
                              super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                              _M_impl.super__Vector_impl_data + lVar14);
            __position._M_current =
                 *(FramePointInfo **)
                  ((long)&(pvVar6->
                          super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                          _M_impl.super__Vector_impl_data + lVar14 + 8);
            if (__position._M_current !=
                *(FramePointInfo **)
                 ((long)&(pvVar6->
                         super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                         _M_impl.super__Vector_impl_data + lVar14 + 0x10)) goto LAB_00107432;
            std::vector<FramePointInfo,std::allocator<FramePointInfo>>::
            _M_realloc_insert<FramePointInfo_const&>(this_00,__position,(FramePointInfo *)local_c8);
          }
          else {
            std::istream::read((char *)datastream,(long)&local_f8);
            _local_c8 = (pointer)CONCAT44((float)(int)local_f8.
                                                  super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_2_ *
                                          local_48,(float)(int)(short)local_f8.
                                                  super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_start *
                                                  local_48);
            uStack_c0._0_6_ =
                 CONCAT24(local_f8.
                          super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start._6_2_,
                          (float)(int)local_f8.
                                      super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_2_ * local_48);
            pFVar3 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pvVar1 = (vector<float,std::allocator<float>> *)
                     ((long)&(pFVar3->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                     lVar11);
            iVar4._M_current =
                 *(float **)
                  ((long)&(pFVar3->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar11 + 8);
            if (iVar4._M_current ==
                *(float **)
                 ((long)&(pFVar3->x).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar11 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (pvVar1,iVar4,(float *)local_c8);
            }
            else {
              *iVar4._M_current =
                   (float)(int)(short)local_f8.
                                      super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start * local_48;
              *(float **)(pvVar1 + 8) = iVar4._M_current + 1;
            }
            pFVar3 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar4._M_current =
                 *(float **)
                  ((long)&(pFVar3->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar11 + 8);
            if (iVar4._M_current ==
                *(float **)
                 ((long)&(pFVar3->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar11 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)
                         ((long)&(pFVar3->y).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl + lVar11),iVar4,(float *)(local_c8 + 4));
            }
            else {
              *iVar4._M_current = fStack_c4;
              *(float **)
               ((long)&(pFVar3->y).super__Vector_base<float,_std::allocator<float>_>._M_impl +
               lVar11 + 8) = iVar4._M_current + 1;
            }
            pFVar3 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar4._M_current =
                 *(float **)
                  ((long)&(pFVar3->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  lVar11 + 8);
            if (iVar4._M_current ==
                *(float **)
                 ((long)&(pFVar3->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                 lVar11 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)
                         ((long)&(pFVar3->z).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl + lVar11),iVar4,(float *)&uStack_c0);
            }
            else {
              *iVar4._M_current = (float)uStack_c0;
              *(float **)
               ((long)&(pFVar3->z).super__Vector_base<float,_std::allocator<float>_>._M_impl +
               lVar11 + 8) = iVar4._M_current + 1;
            }
            pFVar3 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar5._M_current =
                 *(uchar **)
                  ((long)&(pFVar3->cameras).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar11 + 8);
            if (iVar5._M_current ==
                *(uchar **)
                 ((long)&(pFVar3->cameras).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 lVar11 + 0x10)) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         ((long)&(pFVar3->cameras).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar11),iVar5,(uchar *)((long)&uStack_c0 + 4));
            }
            else {
              *iVar5._M_current = uStack_c0._4_1_;
              plVar2 = (long *)((long)&(pFVar3->cameras).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl + lVar11 + 8);
              *plVar2 = *plVar2 + 1;
            }
            pFVar3 = (this->float_point_data).
                     super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar5._M_current =
                 *(uchar **)
                  ((long)&(pFVar3->residual).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar11 + 8);
            if (iVar5._M_current ==
                *(uchar **)
                 ((long)&(pFVar3->residual).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 lVar11 + 0x10)) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         ((long)&(pFVar3->residual).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar11),iVar5,(uchar *)((long)&uStack_c0 + 5));
            }
            else {
              *iVar5._M_current = uStack_c0._5_1_;
              plVar2 = (long *)((long)&(pFVar3->residual).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl + lVar11 + 8);
              *plVar2 = *plVar2 + 1;
            }
            pvVar6 = (this->point_data).
                     super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar9 = ((long)(this->point_data).
                           super__Vector_base<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
                    -0x5555555555555555;
            if (uVar9 < uVar13 || uVar9 - uVar13 == 0) {
LAB_001074a8:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar13);
              goto LAB_001074b9;
            }
            this_00 = (vector<FramePointInfo,std::allocator<FramePointInfo>> *)
                      ((long)&(pvVar6->
                              super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                              _M_impl.super__Vector_impl_data + lVar14);
            __position._M_current =
                 *(FramePointInfo **)
                  ((long)&(pvVar6->
                          super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                          _M_impl.super__Vector_impl_data + lVar14 + 8);
            if (__position._M_current ==
                *(FramePointInfo **)
                 ((long)&(pvVar6->
                         super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>).
                         _M_impl.super__Vector_impl_data + lVar14 + 0x10)) {
              std::vector<FramePointInfo,std::allocator<FramePointInfo>>::
              _M_realloc_insert<FramePointInfo_const&>
                        (this_00,__position,(FramePointInfo *)local_c8);
            }
            else {
LAB_00107432:
              *(pointer *)__position._M_current = _local_c8;
              *(pointer *)&(__position._M_current)->z = uStack_c0;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
            }
          }
          uVar13 = uVar13 + 1;
          lVar11 = lVar11 + 0x78;
          lVar14 = lVar14 + 0x18;
        } while ((ulong)(uint)(int)sVar8 * 0x78 - lVar11 != 0);
      }
      std::istream::seekg((long)datastream,(uint)(this->header).analog_channels << 2);
      uVar12 = (int)local_d8 + 1;
      local_d8 = (ulong)uVar12;
    } while (uVar12 != local_cc);
  }
  return;
}

Assistant:

void C3DFile::readPointSection(ifstream &datastream) {
	float point_scale = getParamFloat("POINT:SCALE");

	//Check point scale value to figure out if the data is stored in integer or floating point format
	//if point_scale is negative the floating point format is used, other wise the integer format
	if (point_scale < 0.) {
		uses_integer_data = false;
		point_scale *= -1.;
	} else {
		uses_integer_data = true;
	}

	// compute the start of the point data
	int data_start = getParamSint16 ("POINT:DATA_START");
	data_start = 512 * ( data_start - 1);
		
	assert (data_start > 512);

	datastream.seekg(data_start, ios::beg);

	Sint16 point_count = getParamSint16("POINT:USED");

	Uint16 frame_count = header.last_frame - header.first_frame + 1;

	/*
	float video_frame_rate = header.video_sampling_rate;
	float analog_frame_rate = header.video_sampling_rate * header.analog_channels_samples;
	Uint16 analog_channel_count = header.analog_channels;

	cout << endl;
	cout << "Frame Count       = " << frame_count << endl;
	cout << "Video Frame Rate  = " << video_frame_rate << endl;
	cout << "Analog Frame Rate = " << analog_frame_rate << endl;
	cout << "Analog channels   = " << analog_channel_count / header.analog_channels_samples << endl;
	cout << endl;
	*/

	// Populate point_data
	int i;
	for (i = 0; i < point_count; i++) {
		FloatMarkerData marker_data;
		float_point_data.push_back(marker_data);
		std::vector<FramePointInfo> frame_data;
		point_data.push_back(frame_data);
	}

	unsigned int frame_index;

	for (frame_index = 0; frame_index < frame_count; frame_index ++) {
		// Read the frames
		for (i = 0; i < point_count; i++) {
			//read data from float data section
			if (!uses_integer_data) {
				FramePointInfo point_info;
				datastream.read(reinterpret_cast<char *>(&point_info), sizeof(FramePointInfo));

				float_point_data[i].x.push_back(point_info.x);
				float_point_data[i].y.push_back(point_info.y);
				float_point_data[i].z.push_back(point_info.z);

			    float_point_data[i].cameras.push_back(point_info.cameras);
			    float_point_data[i].residual.push_back(point_info.residual);

				point_data.at(i).push_back(point_info);
			//read data from int data section
			} else {
				FramePointIntInfo int_point_info;
				datastream.read(reinterpret_cast<char *>(&int_point_info), sizeof(FramePointIntInfo));

				FramePointInfo point_info;
				point_info.x = point_scale * int_point_info.x;
				point_info.y = point_scale * int_point_info.y;
				point_info.z = point_scale * int_point_info.z;
				point_info.cameras = int_point_info.cameras;
				point_info.residual = int_point_info.residual;

				float_point_data[i].x.push_back(point_info.x);
				float_point_data[i].y.push_back(point_info.y);
				float_point_data[i].z.push_back(point_info.z);

			    float_point_data[i].cameras.push_back(point_info.cameras);
			    float_point_data[i].residual.push_back(point_info.residual);

				point_data.at(i).push_back(point_info);
			}
		}

		datastream.seekg((header.analog_channels) * sizeof(float), ios::cur);
	}
}